

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  bool bVar3;
  long lVar4;
  stbi_uc sVar5;
  int iVar6;
  int req_comp_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  int *piVar13;
  long lVar14;
  stbi_uc sVar15;
  uint uVar16;
  char *pcVar17;
  byte bVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  int *local_4b0;
  char *local_4a8;
  float *local_4a0;
  float *local_498;
  ulong local_490;
  int *local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  long local_460;
  long local_458;
  ulong local_450;
  long local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  byte local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  stbi__hdr_gettoken(s,&local_438);
  if (CONCAT17(cStack_42e,
               CONCAT16(cStack_42f,
                        CONCAT15(cStack_430,
                                 CONCAT14(cStack_431,
                                          CONCAT13(cStack_432,
                                                   CONCAT12(cStack_433,
                                                            CONCAT11(cStack_434,cStack_435))))))) ==
      0x45434e41494441 &&
      CONCAT17(cStack_431,
               CONCAT16(cStack_432,
                        CONCAT15(cStack_433,
                                 CONCAT14(cStack_434,
                                          CONCAT13(cStack_435,
                                                   CONCAT12(cStack_436,
                                                            CONCAT11(cStack_437,local_438))))))) ==
      0x4e41494441523f23) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar3 = false;
      local_488 = comp;
      do {
        auVar20[0] = -(cStack_431 == '3');
        auVar20[1] = -(cStack_430 == '2');
        auVar20[2] = -(cStack_42f == '-');
        auVar20[3] = -(cStack_42e == 'b');
        auVar20[4] = -(cStack_42d == 'i');
        auVar20[5] = -(cStack_42c == 't');
        auVar20[6] = -(cStack_42b == '_');
        auVar20[7] = -(cStack_42a == 'r');
        auVar20[8] = -(cStack_429 == 'l');
        auVar20[9] = -(cStack_428 == 'e');
        auVar20[10] = -(cStack_427 == '_');
        auVar20[0xb] = -(cStack_426 == 'r');
        auVar20[0xc] = -(cStack_425 == 'g');
        auVar20[0xd] = -(cStack_424 == 'b');
        auVar20[0xe] = -(cStack_423 == 'e');
        auVar20[0xf] = -(cStack_422 == '\0');
        auVar21[0] = -(local_438 == 'F');
        auVar21[1] = -(cStack_437 == 'O');
        auVar21[2] = -(cStack_436 == 'R');
        auVar21[3] = -(cStack_435 == 'M');
        auVar21[4] = -(cStack_434 == 'A');
        auVar21[5] = -(cStack_433 == 'T');
        auVar21[6] = -(cStack_432 == '=');
        auVar21[7] = -(cStack_431 == '3');
        auVar21[8] = -(cStack_430 == '2');
        auVar21[9] = -(cStack_42f == '-');
        auVar21[10] = -(cStack_42e == 'b');
        auVar21[0xb] = -(cStack_42d == 'i');
        auVar21[0xc] = -(cStack_42c == 't');
        auVar21[0xd] = -(cStack_42b == '_');
        auVar21[0xe] = -(cStack_42a == 'r');
        auVar21[0xf] = -(cStack_429 == 'l');
        auVar21 = auVar21 & auVar20;
        if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
          bVar3 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar3) {
        local_4a8 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_4a8 = &cStack_435;
          uVar8 = strtol(local_4a8,&local_4a8,10);
          local_4a8 = local_4a8 + -1;
          do {
            pcVar17 = local_4a8;
            local_4a8 = pcVar17 + 1;
          } while (pcVar17[1] == ' ');
          iVar6 = strncmp(local_4a8,"+X ",3);
          if (iVar6 == 0) {
            local_4a8 = pcVar17 + 4;
            iVar19 = 0;
            uVar9 = strtol(local_4a8,(char **)0x0,10);
            iVar6 = (int)uVar9;
            *x = iVar6;
            iVar7 = (int)uVar8;
            *y = iVar7;
            if (local_488 != (int *)0x0) {
              *local_488 = 3;
            }
            req_comp_00 = 3;
            if (req_comp != 0) {
              req_comp_00 = req_comp;
            }
            pfVar10 = (float *)malloc((long)(req_comp_00 * iVar7 * iVar6) << 2);
            local_490 = uVar9;
            if (iVar6 - 0x8000U < 0xffff8008) goto LAB_0011989d;
            if (iVar7 < 1) {
              local_4b0 = (int *)0x0;
            }
            else {
              psVar1 = s->buffer_start;
              psVar2 = s->buffer_start + 1;
              local_478 = (ulong)(uint)(iVar6 * 4);
              local_468 = uVar8 & 0x7fffffff;
              local_470 = uVar9 & 0x7fffffff;
              local_460 = (uVar9 & 0xffffffff) * (long)req_comp_00 * 4;
              local_458 = (long)req_comp_00 << 2;
              uVar9 = 0;
              local_4b0 = (int *)0x0;
              local_4a0 = pfVar10;
              local_498 = pfVar10;
              local_480 = uVar8;
              do {
                psVar12 = s->img_buffer;
                if (psVar12 < s->img_buffer_end) {
LAB_001193ed:
                  s->img_buffer = psVar12 + 1;
                  sVar5 = *psVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar6 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar6;
                    }
                    psVar12 = s->img_buffer;
                    goto LAB_001193ed;
                  }
                  sVar5 = '\0';
                }
                psVar12 = s->img_buffer;
                if (psVar12 < s->img_buffer_end) {
LAB_00119461:
                  s->img_buffer = psVar12 + 1;
                  sVar15 = *psVar12;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar6 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar6;
                    }
                    psVar12 = s->img_buffer;
                    goto LAB_00119461;
                  }
                  sVar15 = '\0';
                }
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_001194d5:
                  s->img_buffer = pbVar11 + 1;
                  bVar18 = *pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar6 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar6;
                    }
                    pbVar11 = s->img_buffer;
                    goto LAB_001194d5;
                  }
                  bVar18 = 0;
                }
                pfVar10 = local_4a0;
                if (((sVar5 != '\x02') || (sVar15 != '\x02')) || ((char)bVar18 < '\0')) {
                  local_440 = sVar5;
                  local_43f = sVar15;
                  local_43e = bVar18;
                  local_43d = stbi__get8(s);
                  pfVar10 = local_4a0;
                  stbi__hdr_convert(local_4a0,&local_440,req_comp_00);
                  free(local_4b0);
                  iVar19 = 0;
                  iVar6 = 1;
                  uVar8 = local_480;
                  do {
                    stbi__getn(s,local_43c,4);
                    uVar9 = local_490;
                    stbi__hdr_convert(pfVar10 + (long)(req_comp_00 * (int)local_490 * iVar19) +
                                                (long)(iVar6 * req_comp_00),local_43c,req_comp_00);
                    iVar6 = iVar6 + 1;
                    while ((int)uVar9 <= iVar6) {
                      iVar19 = iVar19 + 1;
LAB_0011989d:
                      iVar6 = 0;
                      if ((int)uVar8 <= iVar19) {
                        return pfVar10;
                      }
                    }
                  } while( true );
                }
                pbVar11 = s->img_buffer;
                if (pbVar11 < s->img_buffer_end) {
LAB_0011956f:
                  s->img_buffer = pbVar11 + 1;
                  uVar16 = (uint)*pbVar11;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar6 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar6 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar2;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar1;
                      s->img_buffer_end = psVar1 + iVar6;
                    }
                    pbVar11 = s->img_buffer;
                    goto LAB_0011956f;
                  }
                  uVar16 = 0;
                }
                uVar8 = local_490;
                if (((uint)bVar18 << 8 | uVar16) != (uint)local_490) {
                  free(pfVar10);
                  free(local_4b0);
                  stbi__g_failure_reason = "invalid decoded scanline length";
                  return (float *)0x0;
                }
                if (local_4b0 == (int *)0x0) {
                  local_4b0 = (int *)malloc(local_478);
                }
                lVar14 = 0;
                piVar13 = local_4b0;
                local_450 = uVar9;
                do {
                  local_448 = lVar14;
                  if (0 < (int)uVar8) {
                    iVar6 = 0;
                    local_488 = piVar13;
                    do {
                      pbVar11 = s->img_buffer;
                      if (pbVar11 < s->img_buffer_end) {
LAB_00119634:
                        s->img_buffer = pbVar11 + 1;
                        uVar16 = (uint)*pbVar11;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                          if (iVar7 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar2;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar1;
                            s->img_buffer_end = psVar1 + iVar7;
                          }
                          pbVar11 = s->img_buffer;
                          goto LAB_00119634;
                        }
                        uVar16 = 0;
                      }
                      if ((byte)uVar16 < 0x81) {
                        if ((byte)uVar16 != 0) {
                          lVar14 = 0;
                          do {
                            psVar12 = s->img_buffer;
                            if (psVar12 < s->img_buffer_end) {
LAB_00119710:
                              s->img_buffer = psVar12 + 1;
                              sVar5 = *psVar12;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                if (iVar7 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar2;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar7;
                                }
                                psVar12 = s->img_buffer;
                                goto LAB_00119710;
                              }
                              sVar5 = '\0';
                            }
                            *(stbi_uc *)(piVar13 + iVar6 + lVar14) = sVar5;
                            lVar14 = lVar14 + 1;
                          } while (uVar16 != (uint)lVar14);
                          iVar6 = iVar6 + (uint)lVar14;
                          piVar13 = local_488;
                          uVar8 = local_490;
                        }
                      }
                      else {
                        psVar12 = s->img_buffer;
                        if (psVar12 < s->img_buffer_end) {
LAB_00119762:
                          s->img_buffer = psVar12 + 1;
                          sVar5 = *psVar12;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar7 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar2;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar7;
                            }
                            psVar12 = s->img_buffer;
                            goto LAB_00119762;
                          }
                          sVar5 = '\0';
                        }
                        if ((uVar16 & 0x7f) != 0) {
                          lVar14 = 0;
                          do {
                            *(stbi_uc *)(piVar13 + iVar6 + lVar14) = sVar5;
                            lVar14 = lVar14 + 1;
                          } while ((uVar16 & 0x7f) != (uint)lVar14);
                          iVar6 = iVar6 + (uint)lVar14;
                        }
                      }
                    } while (iVar6 < (int)uVar8);
                  }
                  lVar4 = local_458;
                  lVar14 = local_448 + 1;
                  piVar13 = (int *)((long)piVar13 + 1);
                } while (lVar14 != 4);
                uVar9 = local_470;
                piVar13 = local_4b0;
                pfVar10 = local_498;
                if (0 < (int)uVar8) {
                  do {
                    stbi__hdr_convert(pfVar10,(stbi_uc *)piVar13,req_comp_00);
                    pfVar10 = (float *)((long)pfVar10 + lVar4);
                    piVar13 = piVar13 + 1;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                uVar9 = local_450 + 1;
                local_498 = (float *)((long)local_498 + local_460);
                pfVar10 = local_4a0;
              } while (uVar9 != local_468);
            }
            free(local_4b0);
            return pfVar10;
          }
        }
        stbi__g_failure_reason = "unsupported data layout";
        return (float *)0x0;
      }
    }
    stbi__g_failure_reason = "unsupported format";
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}